

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::writeMatrixConstructor<3,4>
               (ostream *str,Matrix<float,_4,_3> *m)

{
  ostream *poVar1;
  int extraout_EDX;
  int precision;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar2;
  long lVar3;
  string local_50;
  
  poVar1 = std::operator<<(str,"mat");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,3);
  poVar1 = std::operator<<(poVar1,"x");
  std::ostream::operator<<(poVar1,4);
  std::operator<<(str,"(");
  precision = extraout_EDX;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      if ((int)lVar2 != 0 || (int)lVar3 != 0) {
        std::operator<<(str,", ");
        precision = extraout_EDX_00;
      }
      de::floatToString_abi_cxx11_
                (&local_50,(de *)&DAT_00000001,
                 ((Vector<tcu::Vector<float,_4>,_3> *)((Vector<float,_4> *)m)->m_data)->m_data[0].
                 m_data[lVar2],precision);
      std::operator<<(str,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      precision = extraout_EDX_01;
    }
    m = (Matrix<float,_4,_3> *)((long)m + 0x10);
  }
  std::operator<<(str,")");
  return;
}

Assistant:

void writeMatrixConstructor (std::ostream& str, const tcu::Matrix<float, Rows, Cols>& m)
{
	if (Rows == Cols)
		str << "mat" << Cols;
	else
		str << "mat" << Cols << "x" << Rows;

	str << "(";
	for (int colNdx = 0; colNdx < Cols; colNdx++)
	{
		for (int rowNdx = 0; rowNdx < Rows; rowNdx++)
		{
			if (rowNdx > 0 || colNdx > 0)
				str << ", ";
			str << de::floatToString(m(rowNdx, colNdx), 1);
		}
	}
	str << ")";
}